

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evotiming.c
# Opt level: O2

int evosend(int cnum,int c,int m,int d)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  
  iVar1 = nva_cards[cnum].chipset;
  if (iVar1 < 0xd0) {
    if (iVar1 != 0x50 && iVar1 < 0x84) {
      fwrite("unsupported chipset\n",0x14,1,_stderr);
      return 1;
    }
    uVar4 = (ulong)(c * 8 + 0x610300);
    pvVar2 = nva_cards[cnum].bar0;
    uVar3 = *(uint *)((long)pvVar2 + uVar4);
    *(uint *)((long)pvVar2 + uVar4) = uVar3 | 1;
    *(int *)((long)pvVar2 + (ulong)(c * 8 + 0x610304)) = d;
    *(uint *)((long)pvVar2 + uVar4) = m | 0x80000001;
    do {
    } while (*(int *)((long)pvVar2 + uVar4) < 0);
  }
  else {
    uVar4 = (ulong)(c * 8 + 0x610700);
    pvVar2 = nva_cards[cnum].bar0;
    uVar3 = *(uint *)((long)pvVar2 + uVar4);
    *(uint *)((long)pvVar2 + uVar4) = uVar3 | 1;
    *(int *)((long)pvVar2 + (ulong)(c * 8 + 0x610704)) = d;
    *(uint *)((long)pvVar2 + uVar4) = m | 0x80000001;
    do {
    } while (*(int *)((long)pvVar2 + uVar4) < 0);
  }
  *(uint *)((long)pvVar2 + uVar4) = uVar3;
  return 0;
}

Assistant:

int evosend (int cnum, int c, int m, int d)
{
	uint32_t ctrl;

	if (nva_cards[cnum].chipset >= 0xd0) {
		ctrl = nva_rd32(cnum, 0x610700 + (c * 8));
		nva_wr32(cnum, 0x610700 + (c * 8), ctrl | 1);
		nva_wr32(cnum, 0x610704 + (c * 8), d);
		nva_wr32(cnum, 0x610700 + (c * 8), 0x80000001 | m);
		while (nva_rd32(cnum, 0x610700 + (c * 8)) & 0x80000000);
		nva_wr32(cnum, 0x610700 + (c * 8), ctrl);
	} else
	if (nva_cards[cnum].chipset == 0x50 ||
	    nva_cards[cnum].chipset >= 0x84) {
		ctrl = nva_rd32(cnum, 0x610300 + (c * 8));
		nva_wr32(cnum, 0x610300 + (c * 8), ctrl | 1);
		nva_wr32(cnum, 0x610304 + (c * 8), d);
		nva_wr32(cnum, 0x610300 + (c * 8), 0x80000001 | m);
		while (nva_rd32(cnum, 0x610300 + (c * 8)) & 0x80000000);
		nva_wr32(cnum, 0x610300 + (c * 8), ctrl);
	} else {
		fprintf (stderr, "unsupported chipset\n");
		return 1;
	}

	return 0;
}